

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O0

int checkEquivalence(Abc_Ntk_t *pNtk1,Vec_Int_t *matchedInputs1,Vec_Int_t *matchedOutputs1,
                    Abc_Ntk_t *pNtk2,Vec_Int_t *matchedInputs2,Vec_Int_t *matchedOutputs2)

{
  int iVar1;
  Vec_Ptr_t *iMatchPairs_00;
  Vec_Ptr_t *oMatchPairs_00;
  Abc_Obj_t *pAVar2;
  int local_4c;
  int result;
  int i;
  Vec_Ptr_t *oMatchPairs;
  Vec_Ptr_t *iMatchPairs;
  Vec_Int_t *matchedOutputs2_local;
  Vec_Int_t *matchedInputs2_local;
  Abc_Ntk_t *pNtk2_local;
  Vec_Int_t *matchedOutputs1_local;
  Vec_Int_t *matchedInputs1_local;
  Abc_Ntk_t *pNtk1_local;
  
  iVar1 = Abc_NtkPiNum(pNtk1);
  iMatchPairs_00 = Vec_PtrAlloc(iVar1 << 1);
  iVar1 = Abc_NtkPoNum(pNtk1);
  oMatchPairs_00 = Vec_PtrAlloc(iVar1 << 1);
  local_4c = 0;
  while( true ) {
    iVar1 = Abc_NtkPiNum(pNtk1);
    if (iVar1 <= local_4c) break;
    iVar1 = Vec_IntEntry(matchedInputs2,local_4c);
    pAVar2 = Abc_NtkPi(pNtk2,iVar1);
    Vec_PtrPush(iMatchPairs_00,pAVar2);
    iVar1 = Vec_IntEntry(matchedInputs1,local_4c);
    pAVar2 = Abc_NtkPi(pNtk1,iVar1);
    Vec_PtrPush(iMatchPairs_00,pAVar2);
    local_4c = local_4c + 1;
  }
  local_4c = 0;
  while( true ) {
    iVar1 = Abc_NtkPoNum(pNtk1);
    if (iVar1 <= local_4c) break;
    iVar1 = Vec_IntEntry(matchedOutputs2,local_4c);
    pAVar2 = Abc_NtkPo(pNtk2,iVar1);
    Vec_PtrPush(oMatchPairs_00,pAVar2);
    iVar1 = Vec_IntEntry(matchedOutputs1,local_4c);
    pAVar2 = Abc_NtkPo(pNtk1,iVar1);
    Vec_PtrPush(oMatchPairs_00,pAVar2);
    local_4c = local_4c + 1;
  }
  iVar1 = Abc_NtkBmSat(pNtk1,pNtk2,iMatchPairs_00,oMatchPairs_00,(Vec_Int_t *)0x0,0);
  if (iVar1 == 0) {
    printf("*** Circuits are NOT equivalent ***\n");
  }
  else {
    printf("*** Circuits are equivalent ***\n");
  }
  Vec_PtrFree(iMatchPairs_00);
  Vec_PtrFree(oMatchPairs_00);
  return iVar1;
}

Assistant:

int checkEquivalence( Abc_Ntk_t * pNtk1, Vec_Int_t* matchedInputs1, Vec_Int_t * matchedOutputs1,
                       Abc_Ntk_t * pNtk2, Vec_Int_t* matchedInputs2, Vec_Int_t * matchedOutputs2)
{    
    Vec_Ptr_t * iMatchPairs, * oMatchPairs;
    int i;
    int result;

    iMatchPairs = Vec_PtrAlloc( Abc_NtkPiNum( pNtk1 ) * 2);
    oMatchPairs = Vec_PtrAlloc( Abc_NtkPoNum( pNtk1 ) * 2);

    for(i = 0; i < Abc_NtkPiNum(pNtk1); i++)
    {    
        Vec_PtrPush(iMatchPairs, Abc_NtkPi(pNtk2, Vec_IntEntry(matchedInputs2, i)));
        Vec_PtrPush(iMatchPairs, Abc_NtkPi(pNtk1, Vec_IntEntry(matchedInputs1, i)));
    }
                

    for(i = 0; i < Abc_NtkPoNum(pNtk1); i++)        
    {
        Vec_PtrPush(oMatchPairs, Abc_NtkPo(pNtk2, Vec_IntEntry(matchedOutputs2, i)));
        Vec_PtrPush(oMatchPairs, Abc_NtkPo(pNtk1, Vec_IntEntry(matchedOutputs1, i)));
    }        

    result = Abc_NtkBmSat(pNtk1, pNtk2, iMatchPairs, oMatchPairs, NULL, 0);

    if( result )
        printf("*** Circuits are equivalent ***\n");
    else
        printf("*** Circuits are NOT equivalent ***\n");

    Vec_PtrFree( iMatchPairs );
    Vec_PtrFree( oMatchPairs );    

    return result;
}